

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O2

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CArgument *stm)

{
  CType *pCVar1;
  CIdExp *pCVar2;
  
  pCVar1 = (stm->type)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
           super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
           super__Head_base<0UL,_CType_*,_false>._M_head_impl;
  if (pCVar1 != (CType *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar1->super_IWrapper).super_PositionedNode)(pCVar1,this);
  }
  pCVar2 = (stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if (pCVar2 != (CIdExp *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar2->super_IExpression).super_PositionedNode)(pCVar2,this);
    return;
  }
  return;
}

Assistant:

void CConvertVisitor::Visit(CArgument &stm) {
	if (stm.type){
		stm.type->Accept(*this);
	}
	if (stm.id) {
		stm.id->Accept(*this);
	}
}